

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<std::__cxx11::list<long_double,_std::allocator<long_double>_>_>::Print
               (list<long_double,_std::allocator<long_double>_> *value,ostream *os)

{
  ostream *os_local;
  list<long_double,_std::allocator<long_double>_> *value_local;
  
  PrintTo<std::__cxx11::list<long_double,std::allocator<long_double>>>(value,os);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }